

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURL ** curl_multi_get_handles(CURLM *m)

{
  ulong uVar1;
  CURL **ppCVar2;
  Curl_llist_node *n;
  void *pvVar3;
  ulong uVar4;
  
  ppCVar2 = (CURL **)(*Curl_cmalloc)((ulong)(*(int *)((long)m + 4) + 1) << 3);
  if (ppCVar2 != (CURL **)0x0) {
    n = Curl_llist_head((Curl_llist *)((long)m + 0x30));
    uVar1 = 0;
    while (n != (Curl_llist_node *)0x0) {
      pvVar3 = Curl_node_elem(n);
      uVar4 = uVar1;
      if ((*(byte *)((long)pvVar3 + 0x13c8) & 0x10) == 0) {
        uVar4 = (ulong)((int)uVar1 + 1);
        ppCVar2[uVar1] = pvVar3;
      }
      n = Curl_node_next(n);
      uVar1 = uVar4;
    }
    ppCVar2[uVar1] = (CURL *)0x0;
  }
  return ppCVar2;
}

Assistant:

CURL **curl_multi_get_handles(CURLM *m)
{
  struct Curl_multi *multi = m;
  CURL **a = malloc(sizeof(struct Curl_easy *) * (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_llist_node *e;
    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      struct Curl_easy *data = Curl_node_elem(e);
      DEBUGASSERT(i < multi->num_easy);
      if(!data->state.internal)
        a[i++] = data;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}